

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

ssize_t __thiscall
Json::StyledStreamWriter::write(StyledStreamWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  Value *in_stack_00000038;
  StyledStreamWriter *in_stack_00000040;
  Value *in_stack_000000a8;
  StyledStreamWriter *in_stack_000000b0;
  Value *in_stack_000001e8;
  StyledStreamWriter *in_stack_000001f0;
  
  this->document_ = (ostream *)CONCAT44(in_register_00000034,__fd);
  this->addChildValues_ = false;
  std::__cxx11::string::operator=((string *)&this->indentString_,"");
  writeCommentBeforeValue(in_stack_00000040,in_stack_00000038);
  writeValue(in_stack_000001f0,in_stack_000001e8);
  writeCommentAfterValueOnSameLine(in_stack_000000b0,in_stack_000000a8);
  std::operator<<(this->document_,"\n");
  this->document_ = (ostream *)0x0;
  return (ssize_t)this;
}

Assistant:

void StyledStreamWriter::write(std::ostream& out, const Value& root) {
  document_ = &out;
  addChildValues_ = false;
  indentString_ = "";
  writeCommentBeforeValue(root);
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  *document_ << "\n";
  document_ = NULL; // Forget the stream, for safety.
}